

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_rc_update_rate_correction_factors(AV1_COMP *cpi,int is_encode_stage,int width,int height)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  double dVar3;
  CYCLIC_REFRESH *cr;
  int cyclic_refresh_active;
  int projected_size_based_on_q;
  double adjustment_limit;
  double rate_correction_factor;
  double correction_factor;
  AV1_COMMON *cm;
  double local_88;
  int local_7c;
  double local_78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  double in_stack_ffffffffffffff98;
  AV1_COMP *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  bool bVar4;
  undefined1 uVar5;
  int local_3c;
  double correction_factor_00;
  double __x;
  AV1_COMP *cpi_00;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x77f0);
  correction_factor_00 = 1.0;
  get_rate_correction_factor(cpi_00,0x3ff00000,0);
  bVar4 = false;
  if ((char)in_RDI[0x8480] == '\x03') {
    bVar4 = (char)in_RDI[0x8137] != '\0';
  }
  if ((int)in_RDI[0xc0f5] == 0) {
    uVar5 = bVar4;
    if ((((((char)in_RDI[0x8480] == '\x03') && (*(char *)((long)in_RDI + 0x60cec) == '\x01')) &&
         ((int)in_RDI[0xc0f6] != 0)) &&
        ((*(int *)(in_RDI[0xe255] + 0x70) == 0 &&
         (iVar2 = frame_is_intra_only((AV1_COMMON *)cpi_00), iVar2 == 0)))) &&
       (*(int *)(*in_RDI + 0xc750) == 0)) {
      *(undefined4 *)(in_RDI + 0xc108) =
           *(undefined4 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x25] + 4);
      *(undefined4 *)((long)in_RDI + 0x6083c) =
           *(undefined4 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x25] + 4);
      *(undefined4 *)(in_RDI + 0xc107) = 0;
      *(undefined4 *)((long)in_RDI + 0x60834) = 0;
    }
    else {
      if (bVar4 == false) {
        local_3c = av1_estimate_bits_at_q
                             (in_stack_ffffffffffffffa0,
                              (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                              (double)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
        ;
      }
      else {
        local_3c = av1_cyclic_refresh_estimate_bits_at_q(cpi_00,correction_factor_00);
      }
      if (200 < local_3c) {
        correction_factor_00 = (double)(int)in_RDI[0xc0ef] / (double)local_3c;
      }
      if (correction_factor_00 <= 0.25) {
        correction_factor_00 = 0.25;
      }
      *(undefined4 *)(in_RDI + 0xc108) = *(undefined4 *)((long)in_RDI + 0x6083c);
      *(undefined4 *)((long)in_RDI + 0x6083c) =
           *(undefined4 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x25] + 4);
      *(undefined4 *)(in_RDI + 0xc107) = *(undefined4 *)((long)in_RDI + 0x60834);
      if (correction_factor_00 <= 1.1) {
        if (0.9 <= correction_factor_00) {
          *(undefined4 *)((long)in_RDI + 0x60834) = 0;
        }
        else {
          *(undefined4 *)((long)in_RDI + 0x60834) = 1;
        }
      }
      else {
        *(undefined4 *)((long)in_RDI + 0x60834) = 0xffffffff;
      }
      __x = correction_factor_00;
      if (0.0 < correction_factor_00) {
        if (*(int *)((long)in_RDI + 0x9d2fc) == 0) {
          dVar3 = log10(correction_factor_00);
          if (ABS(dVar3) <= 0.5) {
            in_stack_ffffffffffffff98 = log10(__x);
            in_stack_ffffffffffffff98 = ABS(in_stack_ffffffffffffff98);
          }
          else {
            in_stack_ffffffffffffff98 = 0.5;
          }
        }
        else {
          dVar3 = log10(correction_factor_00);
          if (ABS(dVar3) <= 0.5) {
            dVar3 = log10(__x);
            in_stack_ffffffffffffffa0 = (AV1_COMP *)((ulong)dVar3 & 0x7fffffffffffffff);
          }
          else {
            in_stack_ffffffffffffffa0 = (AV1_COMP *)0x3fe0000000000000;
          }
        }
      }
      if ((bVar4 != false) && (0 < *(int *)((long)in_RDI + 0x60774))) {
        lVar1 = in_RDI[0xe255];
        if (__x <= 1.25) {
          if (__x < 0.5) {
            if (*(int *)(lVar1 + 4) + 1 < 5) {
              local_7c = *(int *)(lVar1 + 4) + 1;
            }
            else {
              local_7c = 5;
            }
            *(int *)(lVar1 + 4) = local_7c;
            if (0.25 <= *(double *)(lVar1 + 0x50) + 0.05) {
              local_88 = 0.25;
            }
            else {
              local_88 = *(double *)(lVar1 + 0x50) + 0.05;
            }
            *(double *)(lVar1 + 0x50) = local_88;
          }
        }
        else {
          if (*(int *)(lVar1 + 4) + -1 < -4) {
            iVar2 = -5;
          }
          else {
            iVar2 = *(int *)(lVar1 + 4) + -1;
          }
          *(int *)(lVar1 + 4) = iVar2;
          if (*(double *)(lVar1 + 0x50) - 0.05 <= -0.0) {
            local_78 = -0.0;
          }
          else {
            local_78 = *(double *)(lVar1 + 0x50) - 0.05;
          }
          *(double *)(lVar1 + 0x50) = local_78;
        }
      }
      set_rate_correction_factor
                ((AV1_COMP *)CONCAT17(uVar5,in_stack_ffffffffffffffb0),
                 (int)((ulong)correction_factor_00 >> 0x20),(double)in_stack_ffffffffffffffa0,
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),SUB84(in_stack_ffffffffffffff98,0))
      ;
    }
  }
  return;
}

Assistant:

void av1_rc_update_rate_correction_factors(AV1_COMP *cpi, int is_encode_stage,
                                           int width, int height) {
  const AV1_COMMON *const cm = &cpi->common;
  double correction_factor = 1.0;
  double rate_correction_factor =
      get_rate_correction_factor(cpi, width, height);
  double adjustment_limit;
  int projected_size_based_on_q = 0;
  int cyclic_refresh_active =
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cpi->common.seg.enabled;

  // Do not update the rate factors for arf overlay frames.
  if (cpi->rc.is_src_frame_alt_ref) return;

  // Don't update rate correction factors here on scene changes as
  // it is already reset in av1_encodedframe_overshoot_cbr(),
  // but reset variables related to previous frame q and size.
  // Note that the counter of frames since the last scene change
  // is only valid when cyclic refresh mode is enabled and that
  // this break out only applies to scene changes that are not
  // recorded as INTRA only key frames.
  // Note that av1_encodedframe_overshoot_cbr() is only entered
  // if cpi->sf.rt_sf.overshoot_detection_cbr == FAST_DETECTION_MAXQ
  // and cpi->rc.high_source_sad = 1.
  if ((cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ) &&
      (cpi->sf.rt_sf.overshoot_detection_cbr == FAST_DETECTION_MAXQ) &&
      cpi->rc.high_source_sad &&
      (cpi->cyclic_refresh->counter_encode_maxq_scene_change == 0) &&
      !frame_is_intra_only(cm) && !cpi->ppi->use_svc) {
    cpi->rc.q_2_frame = cm->quant_params.base_qindex;
    cpi->rc.q_1_frame = cm->quant_params.base_qindex;
    cpi->rc.rc_2_frame = 0;
    cpi->rc.rc_1_frame = 0;
    return;
  }

  // Clear down mmx registers to allow floating point in what follows

  // Work out how big we would have expected the frame to be at this Q given
  // the current correction factor.
  // Stay in double to avoid int overflow when values are large
  if (cyclic_refresh_active) {
    projected_size_based_on_q =
        av1_cyclic_refresh_estimate_bits_at_q(cpi, rate_correction_factor);
  } else {
    projected_size_based_on_q = av1_estimate_bits_at_q(
        cpi, cm->quant_params.base_qindex, rate_correction_factor);
  }
  // Work out a size correction factor.
  if (projected_size_based_on_q > FRAME_OVERHEAD_BITS)
    correction_factor = (double)cpi->rc.projected_frame_size /
                        (double)projected_size_based_on_q;

  // Clamp correction factor to prevent anything too extreme
  correction_factor = AOMMAX(correction_factor, 0.25);

  cpi->rc.q_2_frame = cpi->rc.q_1_frame;
  cpi->rc.q_1_frame = cm->quant_params.base_qindex;
  cpi->rc.rc_2_frame = cpi->rc.rc_1_frame;
  if (correction_factor > 1.1)
    cpi->rc.rc_1_frame = -1;
  else if (correction_factor < 0.9)
    cpi->rc.rc_1_frame = 1;
  else
    cpi->rc.rc_1_frame = 0;

  // Decide how heavily to dampen the adjustment
  if (correction_factor > 0.0) {
    if (cpi->is_screen_content_type) {
      adjustment_limit =
          0.25 + 0.5 * AOMMIN(0.5, fabs(log10(correction_factor)));
    } else {
      adjustment_limit =
          0.25 + 0.75 * AOMMIN(0.5, fabs(log10(correction_factor)));
    }
  } else {
    adjustment_limit = 0.75;
  }

  // Adjustment to delta Q and number of blocks updated in cyclic refresh
  // based on over or under shoot of target in current frame.
  if (cyclic_refresh_active && cpi->rc.this_frame_target > 0) {
    CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
    if (correction_factor > 1.25) {
      cr->percent_refresh_adjustment =
          AOMMAX(cr->percent_refresh_adjustment - 1, -5);
      cr->rate_ratio_qdelta_adjustment =
          AOMMAX(cr->rate_ratio_qdelta_adjustment - 0.05, -0.0);
    } else if (correction_factor < 0.5) {
      cr->percent_refresh_adjustment =
          AOMMIN(cr->percent_refresh_adjustment + 1, 5);
      cr->rate_ratio_qdelta_adjustment =
          AOMMIN(cr->rate_ratio_qdelta_adjustment + 0.05, 0.25);
    }
  }

  if (correction_factor > 1.01) {
    // We are not already at the worst allowable quality
    correction_factor = (1.0 + ((correction_factor - 1.0) * adjustment_limit));
    rate_correction_factor = rate_correction_factor * correction_factor;
    // Keep rate_correction_factor within limits
    if (rate_correction_factor > MAX_BPB_FACTOR)
      rate_correction_factor = MAX_BPB_FACTOR;
  } else if (correction_factor < 0.99) {
    // We are not already at the best allowable quality
    correction_factor = 1.0 / correction_factor;
    correction_factor = (1.0 + ((correction_factor - 1.0) * adjustment_limit));
    correction_factor = 1.0 / correction_factor;

    rate_correction_factor = rate_correction_factor * correction_factor;

    // Keep rate_correction_factor within limits
    if (rate_correction_factor < MIN_BPB_FACTOR)
      rate_correction_factor = MIN_BPB_FACTOR;
  }

  set_rate_correction_factor(cpi, is_encode_stage, rate_correction_factor,
                             width, height);
}